

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_declaration_statement(gravity_parser_t *parser)

{
  gnode_n gVar1;
  gravity_lexer_t *pgVar2;
  size_t sVar3;
  gravity_lexer_t *lexer;
  long *plVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  bool bVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  _Bool _Var23;
  _Bool _Var24;
  gtoken_t gVar25;
  gtoken_t gVar26;
  gtoken_t storage_specifier;
  gtoken_t gVar27;
  uint32_t uVar28;
  gnode_t *declaration;
  symboltable_t *symtable;
  gnode_r *pgVar29;
  gnode_t **ppgVar30;
  gnode_r *pgVar31;
  gnode_r *declarations;
  char *pcVar32;
  gnode_t *pgVar33;
  gnode_t *pgVar34;
  char *pcVar35;
  char *pcVar36;
  size_t sVar37;
  gnode_t *pgVar38;
  gliteral_t value;
  gnode_variable_decl_t *vdec_node;
  int iVar39;
  gnode_function_decl_t *func;
  gtoken_s enum_token;
  gtoken_s token;
  gliteral_t local_158;
  gnode_t *local_150;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  
  pgVar2 = parser->lexer->p[parser->lexer->n - 1];
  gVar25 = gravity_lexer_peek(pgVar2);
  _Var23 = token_isaccess_specifier(gVar25);
  storage_specifier = TOK_EOF;
  gVar26 = TOK_EOF;
  if (_Var23) {
    gVar26 = gravity_lexer_next(pgVar2);
    gVar25 = gravity_lexer_peek(pgVar2);
  }
  _Var23 = token_isstorage_specifier(gVar25);
  if (_Var23) {
    storage_specifier = gravity_lexer_next(pgVar2);
    gVar25 = gravity_lexer_peek(pgVar2);
  }
  if ((int)gVar25 < 0x17) {
    if (gVar25 == TOK_MACRO) {
      parse_macro_statement(parser);
      return (gnode_t *)0x0;
    }
    if (gVar25 != TOK_KEY_FUNC) goto switchD_0011b24d_caseD_3;
    declaration = parse_function(parser,true,gVar26,storage_specifier);
    pgVar34 = get_enclosing(parser,NODE_FUNCTION_DECL);
    if (pgVar34 == (gnode_t *)0x0) {
      return declaration;
    }
    *(undefined1 *)((long)&declaration[1].token.value + 5) = 1;
    pcVar35 = *(char **)&declaration[1].token.colno;
    pcVar32 = (char *)0x0;
    goto LAB_0011baf2;
  }
  switch(gVar25 - TOK_KEY_ENUM) {
  case TOK_EOF:
switchD_0011b24d_caseD_0:
    pgVar2 = parser->lexer->p[parser->lexer->n - 1];
    gVar25 = gravity_lexer_next(pgVar2);
    gravity_lexer_token(pgVar2);
    if (gVar25 != TOK_KEY_ENUM) {
      __assert_fail("type == TOK_KEY_ENUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x599,"gnode_t *parse_enum_declaration(gravity_parser_t *, gtoken_t, gtoken_t)"
                   );
    }
    pcVar35 = parse_identifier(parser);
    _Var23 = parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    if (!_Var23) {
      return (gnode_t *)0x0;
    }
    symtable = symboltable_create(SYMTABLE_TAG_ENUM);
    sVar3 = parser->declarations->n;
    if (sVar3 == 0) {
      pgVar34 = (gnode_t *)0x0;
    }
    else {
      pgVar34 = parser->declarations->p[sVar3 - 1];
    }
    token_01.lineno = uStack_10c;
    token_01.type = local_110;
    token_01.colno = uStack_108;
    token_01.position = uStack_104;
    token_01.bytes = local_100;
    token_01.length = uStack_fc;
    token_01.fileid = uStack_f8;
    token_01.builtin = uStack_f4;
    token_01.value = local_f0;
    declaration = gnode_enum_decl_create(token_01,pcVar35,gVar26,storage_specifier,symtable,pgVar34)
    ;
    local_158 = LITERAL_INT;
    iVar39 = 0;
    local_150 = (gnode_t *)0x0;
    do {
      gVar25 = gravity_lexer_peek(pgVar2);
      if (gVar25 == TOK_OP_CLOSED_CURLYBRACE) break;
      gVar25 = gravity_lexer_peek(pgVar2);
      if (gVar25 == TOK_IDENTIFIER) {
        pcVar32 = parse_identifier(parser);
        gravity_lexer_token(pgVar2);
      }
      else {
        pcVar32 = (char *)0x0;
      }
      if (pcVar32 == (char *)0x0) {
        token_name(gVar25);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x14470c);
      }
      gVar25 = gravity_lexer_peek(pgVar2);
      gravity_lexer_token(pgVar2);
      _Var23 = token_isvariable_assignment(gVar25);
      if (((!_Var23) && (gVar25 != TOK_OP_COMMA)) && (gVar25 != TOK_OP_CLOSED_CURLYBRACE)) {
        token_name(gVar25);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x144731);
      }
      _Var23 = token_isvariable_assignment(gVar25);
      if ((!_Var23) && (local_158 != LITERAL_INT)) {
        token_name(gVar25);
        report_error(parser,GRAVITY_ERROR_SYNTAX,0x14474c);
      }
      _Var23 = token_isvariable_assignment(gVar25);
      if (_Var23) {
        gravity_lexer_next(pgVar2);
        pgVar34 = parse_precedence(parser,PREC_LOWEST);
      }
      else {
        pgVar34 = (gnode_t *)0x0;
      }
      if (pgVar34 == (gnode_t *)0x0) {
        sVar3 = parser->declarations->n;
        if (sVar3 == 0) {
          pgVar34 = (gnode_t *)0x0;
        }
        else {
          pgVar34 = parser->declarations->p[sVar3 - 1];
        }
        pgVar34 = gnode_literal_int_expr_create((gtoken_s)ZEXT840(0),(int64_t)local_150,pgVar34);
        local_150 = (gnode_t *)((long)local_150 + 1);
LAB_0011bf79:
        if (pcVar32 != (char *)0x0) {
          _Var23 = symboltable_insert(symtable,pcVar32,pgVar34);
          if (!_Var23) {
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x144838,pcVar32);
            gnode_free(pgVar34);
          }
          free(pcVar32);
        }
        iVar39 = iVar39 + 1;
        gVar25 = gravity_lexer_peek(pgVar2);
        bVar16 = true;
        if (gVar25 == TOK_OP_COMMA) {
          gravity_lexer_next(pgVar2);
          goto LAB_0011c001;
        }
      }
      else {
        pgVar38 = pgVar34;
        if (pgVar34->tag == NODE_LITERAL_EXPR) {
LAB_0011bedc:
          if (((iVar39 != 0) || (value = pgVar38[1].tag, LITERAL_BOOL < value)) ||
             (value == LITERAL_INT)) {
            value = local_158;
          }
          if (pgVar38[1].tag != value) {
            token_literal_name(value);
            report_error(parser,GRAVITY_ERROR_SYNTAX,0x144810);
          }
          bVar16 = false;
          local_158 = value;
          if (pgVar38[1].tag == NODE_LABEL_STAT) {
            local_150 = (gnode_t *)(*(long *)&pgVar38[1].block_length + 1);
          }
        }
        else if (pgVar34->tag == NODE_UNARY_EXPR) {
          pgVar38 = *(gnode_t **)&pgVar34[1].block_length;
          if (pgVar38->tag == NODE_LITERAL_EXPR) {
            if ((pgVar34[1].tag & ~NODE_COMPOUND_STAT) != 0x32) {
              pcVar36 = "Only + or - allowed in enum value definition.";
              goto LAB_0011bebc;
            }
            gVar1 = pgVar38[1].tag;
            if (gVar1 - NODE_COMPOUND_STAT < 2) {
              bVar16 = false;
              bVar15 = true;
              if (pgVar34[1].tag == 0x33) {
                if (gVar1 == NODE_LABEL_STAT) {
                  sVar3 = parser->declarations->n;
                  pgVar33 = (gnode_t *)0x0;
                  if (sVar3 != 0) {
                    pgVar33 = parser->declarations->p[sVar3 - 1];
                  }
                  uVar5 = (pgVar34->token).position;
                  uVar17 = (pgVar34->token).type;
                  uVar18 = (pgVar34->token).lineno;
                  uVar19 = (pgVar34->token).colno;
                  token_02.colno = uVar19;
                  token_02.lineno = uVar18;
                  token_02.type = uVar17;
                  uVar6 = (pgVar34->token).bytes;
                  uVar7 = (pgVar34->token).length;
                  uVar8 = (pgVar34->token).fileid;
                  uVar9 = (pgVar34->token).builtin;
                  token_02.position = uVar5;
                  token_02.bytes = uVar6;
                  token_02.length = uVar7;
                  token_02.fileid = uVar8;
                  token_02.builtin = uVar9;
                  token_02.value = (pgVar34->token).value;
                  pgVar33 = gnode_literal_int_expr_create
                                      (token_02,-*(long *)&pgVar38[1].block_length,pgVar33);
                }
                else if (gVar1 == NODE_COMPOUND_STAT) {
                  sVar3 = parser->declarations->n;
                  if (sVar3 == 0) {
                    pgVar33 = (gnode_t *)0x0;
                  }
                  else {
                    pgVar33 = parser->declarations->p[sVar3 - 1];
                  }
                  uVar10 = (pgVar34->token).position;
                  uVar20 = (pgVar34->token).type;
                  uVar21 = (pgVar34->token).lineno;
                  uVar22 = (pgVar34->token).colno;
                  token_03.colno = uVar22;
                  token_03.lineno = uVar21;
                  token_03.type = uVar20;
                  uVar11 = (pgVar34->token).bytes;
                  uVar12 = (pgVar34->token).length;
                  uVar13 = (pgVar34->token).fileid;
                  uVar14 = (pgVar34->token).builtin;
                  token_03.position = uVar10;
                  token_03.bytes = uVar11;
                  token_03.length = uVar12;
                  token_03.fileid = uVar13;
                  token_03.builtin = uVar14;
                  token_03.value = (pgVar34->token).value;
                  pgVar33 = gnode_literal_float_expr_create
                                      (token_03,-*(double *)&pgVar38[1].block_length,pgVar33);
                }
                else {
                  pgVar33 = (gnode_t *)0x0;
                }
                if (pgVar33 != (gnode_t *)0x0) {
                  gnode_free(pgVar34);
                  pgVar34 = pgVar33;
                  pgVar38 = pgVar33;
                }
                bVar16 = false;
              }
            }
            else {
              bVar15 = false;
              report_error(parser,GRAVITY_ERROR_SYNTAX,0x1447c4);
              bVar16 = true;
            }
          }
          else {
            pcVar36 = "Literal value expected here.";
LAB_0011bebc:
            report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar36);
            pgVar38 = (gnode_t *)0x0;
            bVar16 = true;
            bVar15 = false;
          }
          if (bVar15) goto LAB_0011bedc;
        }
        else {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x144779);
          bVar16 = true;
        }
        if (!bVar16) goto LAB_0011bf79;
LAB_0011c001:
        bVar16 = false;
      }
    } while (!bVar16);
    parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    parse_semicolon(parser);
    if (iVar39 == 0) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x144852,pcVar35);
    }
    pgVar34 = get_enclosing(parser,NODE_FUNCTION_DECL);
    if (pgVar34 == (gnode_t *)0x0) {
      return declaration;
    }
    pcVar32 = (char *)0x0;
    break;
  case TOK_ERROR:
  case TOK_COMMENT:
switchD_0011b24d_caseD_1:
    pgVar2 = parser->lexer->p[parser->lexer->n - 1];
    gVar25 = gravity_lexer_next(pgVar2);
    gravity_lexer_token(pgVar2);
    pcVar35 = parse_identifier(parser);
    gVar27 = gravity_lexer_peek(pgVar2);
    if (gVar27 == TOK_OP_COLON) {
      gravity_lexer_next(pgVar2);
      local_150 = parse_id(parser);
    }
    else {
      local_150 = (gnode_t *)0x0;
    }
    gVar27 = gravity_lexer_peek(pgVar2);
    if (gVar27 == TOK_OP_LESS) {
      gravity_lexer_next(pgVar2);
      lexer = parser->lexer->p[parser->lexer->n - 1];
      gVar27 = gravity_lexer_peek(lexer);
      if (gVar27 == TOK_OP_GREATER) {
        pgVar29 = (gnode_r *)0x0;
      }
      else {
        pgVar29 = gnode_array_create();
        _Var23 = token_isidentifier(gVar27);
        if (_Var23) {
          do {
            pgVar34 = parse_id(parser);
            if (pgVar34 != (gnode_t *)0x0) {
              sVar3 = pgVar29->m;
              if (pgVar29->n == sVar3) {
                sVar37 = sVar3 * 2;
                if (sVar3 == 0) {
                  sVar37 = 8;
                }
                pgVar29->m = sVar37;
                ppgVar30 = (gnode_t **)realloc(pgVar29->p,sVar37 << 3);
                pgVar29->p = ppgVar30;
              }
              sVar3 = pgVar29->n;
              pgVar29->n = sVar3 + 1;
              pgVar29->p[sVar3] = pgVar34;
            }
            gVar27 = gravity_lexer_peek(lexer);
            if (gVar27 != TOK_OP_COMMA) goto LAB_0011b6ca;
            gravity_lexer_next(lexer);
            _Var23 = token_isidentifier(TOK_OP_COMMA);
          } while (_Var23);
        }
        if (pgVar29 != (gnode_r *)0x0) {
          if (pgVar29->p != (gnode_t **)0x0) {
            free(pgVar29->p);
          }
          free(pgVar29);
        }
        pgVar29 = (gnode_r *)0x0;
      }
LAB_0011b6ca:
      parse_required(parser,TOK_OP_GREATER);
    }
    else {
      pgVar29 = (gnode_r *)0x0;
    }
    if (storage_specifier != TOK_KEY_EXTERN) {
      parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    }
    pgVar31 = gnode_array_create();
    pgVar34 = get_enclosing(parser,NODE_CLASS_DECL);
    if (pgVar34 != (gnode_t *)0x0) {
      declarations = gnode_array_create();
      pcVar32 = string_dup("outer");
      sVar3 = parser->declarations->n;
      if (sVar3 == 0) {
        pgVar34 = (gnode_t *)0x0;
      }
      else {
        pgVar34 = parser->declarations->p[sVar3 - 1];
      }
      pgVar34 = gnode_variable_create
                          ((gtoken_s)ZEXT840(0),pcVar32,(char *)0x0,(gnode_t *)0x0,pgVar34,
                           (gnode_variable_decl_t *)0x0);
      sVar3 = declarations->m;
      if (declarations->n == sVar3) {
        sVar37 = 8;
        if (sVar3 != 0) {
          sVar37 = sVar3 * 2;
        }
        declarations->m = sVar37;
        ppgVar30 = (gnode_t **)realloc(declarations->p,sVar37 << 3);
        declarations->p = ppgVar30;
      }
      sVar3 = declarations->n;
      declarations->n = sVar3 + 1;
      declarations->p[sVar3] = pgVar34;
      sVar3 = parser->declarations->n;
      if (sVar3 == 0) {
        pgVar34 = (gnode_t *)0x0;
      }
      else {
        pgVar34 = parser->declarations->p[sVar3 - 1];
      }
      pgVar34 = gnode_variable_decl_create
                          ((gtoken_s)ZEXT840(0),TOK_KEY_VAR,TOK_KEY_PRIVATE,TOK_EOF,declarations,
                           pgVar34);
      sVar3 = pgVar31->m;
      if (pgVar31->n == sVar3) {
        sVar37 = 8;
        if (sVar3 != 0) {
          sVar37 = sVar3 * 2;
        }
        pgVar31->m = sVar37;
        ppgVar30 = (gnode_t **)realloc(pgVar31->p,sVar37 << 3);
        pgVar31->p = ppgVar30;
      }
      sVar3 = pgVar31->n;
      pgVar31->n = sVar3 + 1;
      pgVar31->p[sVar3] = pgVar34;
    }
    sVar3 = parser->declarations->n;
    if (sVar3 == 0) {
      pgVar34 = (gnode_t *)0x0;
    }
    else {
      pgVar34 = parser->declarations->p[sVar3 - 1];
    }
    token_00.lineno = uStack_10c;
    token_00.type = local_110;
    token_00.colno = uStack_108;
    token_00.position = uStack_104;
    token_00.bytes = local_100;
    token_00.length = uStack_fc;
    token_00.fileid = uStack_f8;
    token_00.builtin = uStack_f4;
    token_00.value = local_f0;
    declaration = gnode_class_decl_create
                            (token_00,pcVar35,gVar26,storage_specifier,local_150,pgVar29,
                             (gnode_r *)0x0,gVar25 == TOK_KEY_STRUCT,pgVar34);
    if (storage_specifier != TOK_KEY_EXTERN) {
      pgVar29 = parser->declarations;
      sVar3 = pgVar29->m;
      if (pgVar29->n == sVar3) {
        sVar37 = 8;
        if (sVar3 != 0) {
          sVar37 = sVar3 * 2;
        }
        pgVar29->m = sVar37;
        ppgVar30 = (gnode_t **)realloc(pgVar29->p,sVar37 << 3);
        parser->declarations->p = ppgVar30;
      }
      pgVar29 = parser->declarations;
      sVar3 = pgVar29->n;
      pgVar29->n = sVar3 + 1;
      pgVar29->p[sVar3] = declaration;
      gVar25 = gravity_lexer_peek(pgVar2);
      while ((_Var23 = token_isdeclaration_statement(gVar25), _Var23 ||
             (_Var23 = token_ismacro(gVar25), _Var23))) {
        pgVar34 = parse_declaration_statement(parser);
        if (pgVar34 != (gnode_t *)0x0) {
          sVar3 = pgVar31->m;
          if (pgVar31->n == sVar3) {
            sVar37 = sVar3 * 2;
            if (sVar3 == 0) {
              sVar37 = 8;
            }
            pgVar31->m = sVar37;
            ppgVar30 = (gnode_t **)realloc(pgVar31->p,sVar37 << 3);
            pgVar31->p = ppgVar30;
          }
          gVar1 = pgVar34->tag;
          if (gVar1 == NODE_FUNCTION_DECL) {
            pcVar32 = *(char **)&pgVar34[1].token.colno;
            if ((pcVar32 != (char *)0x0) && (pgVar34[1].block_length == 0)) {
              pgVar34[1].block_length = (uint)(*pcVar32 != '_') * 3 + 0x1a;
            }
          }
          else if (gVar1 == NODE_CLASS_DECL) {
            pcVar32 = *(char **)&pgVar34[1].token.colno;
            if ((pcVar32 != (char *)0x0) && (pgVar34[1].token.type == TOK_EOF)) {
              pgVar34[1].token.type = (uint)(*pcVar32 != '_') * 3 + TOK_KEY_PRIVATE;
            }
          }
          else if ((gVar1 == NODE_VARIABLE_DECL) && (pgVar34[1].refcount == 0)) {
            plVar4 = *(long **)&pgVar34[1].token;
            uVar28 = 0x1d;
            if ((plVar4 != (long *)0x0) &&
               ((*plVar4 != 0 && (*(char **)(*(long *)plVar4[2] + 0x50) != (char *)0x0)))) {
              uVar28 = (uint)(**(char **)(*(long *)plVar4[2] + 0x50) != '_') * 3 + 0x1a;
            }
            pgVar34[1].refcount = uVar28;
          }
          sVar3 = pgVar31->n;
          pgVar31->n = sVar3 + 1;
          pgVar31->p[sVar3] = pgVar34;
        }
        gVar25 = gravity_lexer_peek(pgVar2);
      }
      parser->declarations->n = parser->declarations->n - 1;
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    parse_semicolon(parser);
    *(gnode_r **)&declaration[1].is_assignment = pgVar31;
    pgVar34 = get_enclosing(parser,NODE_FUNCTION_DECL);
    if (pgVar34 == (gnode_t *)0x0) {
      return declaration;
    }
    pcVar32 = string_dup(gravity_class_class->identifier);
    break;
  case TOK_STRING:
  case TOK_NUMBER:
  case TOK_IDENTIFIER:
  case TOK_SPECIAL:
  case TOK_MACRO:
  case TOK_KEY_FUNC:
  case TOK_KEY_SUPER:
  case TOK_KEY_IF:
  case TOK_KEY_ELSE:
switchD_0011b24d_caseD_3:
    gravity_lexer_token(pgVar2);
    pcVar35 = token_name(gVar25);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x144698,pcVar35);
    return (gnode_t *)0x0;
  case TOK_KEY_DEFAULT:
  case TOK_KEY_TRUE:
switchD_0011b24d_caseD_a:
    pgVar34 = parse_variable_declaration(parser,true,gVar26,storage_specifier);
    return pgVar34;
  case TOK_KEY_FALSE:
switchD_0011b24d_caseD_c:
    pgVar2 = parser->lexer->p[parser->lexer->n - 1];
    gVar26 = gravity_lexer_next(pgVar2);
    gravity_lexer_token(pgVar2);
    if (gVar26 != TOK_KEY_MODULE) {
      __assert_fail("type == TOK_KEY_MODULE",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x641,
                    "gnode_t *parse_module_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    parse_identifier(parser);
    _Var23 = parse_optional(parser,TOK_OP_OPEN_CURLYBRACE);
    pgVar29 = gnode_array_create();
    gVar26 = gravity_lexer_peek(pgVar2);
    _Var24 = token_isdeclaration_statement(gVar26);
    if (_Var24) {
      do {
        pgVar34 = parse_declaration_statement(parser);
        if (pgVar34 != (gnode_t *)0x0) {
          sVar3 = pgVar29->m;
          if (pgVar29->n == sVar3) {
            sVar37 = sVar3 * 2;
            if (sVar3 == 0) {
              sVar37 = 8;
            }
            pgVar29->m = sVar37;
            ppgVar30 = (gnode_t **)realloc(pgVar29->p,sVar37 << 3);
            pgVar29->p = ppgVar30;
          }
          sVar3 = pgVar29->n;
          pgVar29->n = sVar3 + 1;
          pgVar29->p[sVar3] = pgVar34;
        }
        gVar26 = gravity_lexer_peek(pgVar2);
        _Var24 = token_isdeclaration_statement(gVar26);
      } while (_Var24);
    }
    if (_Var23) {
      parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
    }
    parse_semicolon(parser);
    pcVar35 = "Module declarations not yet supported.";
LAB_0011b59a:
    report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar35);
    return (gnode_t *)0x0;
  case TOK_KEY_SWITCH:
switchD_0011b24d_caseD_f:
    pgVar2 = parser->lexer->p[parser->lexer->n - 1];
    gVar26 = gravity_lexer_next(pgVar2);
    gravity_lexer_token(pgVar2);
    if (gVar26 != TOK_KEY_EVENT) {
      __assert_fail("type == TOK_KEY_EVENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                    ,0x669,
                    "gnode_t *parse_event_declaration(gravity_parser_t *, gtoken_t, gtoken_t)");
    }
    pcVar35 = "Event declarations not yet supported.";
    goto LAB_0011b59a;
  default:
    if (gVar25 != TOK_OP_SEMICOLON) goto switchD_0011b24d_caseD_3;
    if (gVar26 != TOK_EOF || storage_specifier != TOK_EOF) {
      gravity_lexer_token(pgVar2);
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x144667);
    }
    switch(gVar25 - TOK_KEY_ENUM) {
    case TOK_EOF:
      goto switchD_0011b24d_caseD_0;
    case TOK_ERROR:
    case TOK_COMMENT:
      goto switchD_0011b24d_caseD_1;
    case TOK_STRING:
    case TOK_NUMBER:
    case TOK_IDENTIFIER:
    case TOK_SPECIAL:
    case TOK_MACRO:
    case TOK_KEY_FUNC:
    case TOK_KEY_SUPER:
    case TOK_KEY_IF:
    case TOK_KEY_ELSE:
      goto switchD_0011b24d_caseD_3;
    case TOK_KEY_DEFAULT:
    case TOK_KEY_TRUE:
      goto switchD_0011b24d_caseD_a;
    case TOK_KEY_FALSE:
      goto switchD_0011b24d_caseD_c;
    case TOK_KEY_SWITCH:
      goto switchD_0011b24d_caseD_f;
    default:
      pgVar34 = parse_empty_statement(parser);
      return pgVar34;
    }
  }
LAB_0011baf2:
  pgVar34 = local_store_declaration(parser,pcVar35,pcVar32,gVar26,storage_specifier,declaration);
  return pgVar34;
}

Assistant:

static gnode_t *parse_declaration_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_declaration_statement");

    DECLARE_LEXER;
    gtoken_t peek = gravity_lexer_peek(lexer);
    gtoken_t access_specifier = 0;    // 0 means no access specifier set
    gtoken_t storage_specifier = 0;    // 0 means no storage specifier set

    // check if an access specifier is set
    if (token_isaccess_specifier(peek)) {
        access_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // check if a storage specifier is set
    if (token_isstorage_specifier(peek)) {
        storage_specifier = gravity_lexer_next(lexer);
        peek = gravity_lexer_peek(lexer);
    }

    // it is a syntax error to specify an access or storage specifier followed by an empty declaration
    if ((peek == TOK_OP_SEMICOLON) && ((access_specifier) || (storage_specifier))) {
        REPORT_ERROR(gravity_lexer_token(lexer), "Access or storage specifier cannot be used here.");
    }

    switch (peek) {
        case TOK_MACRO: return parse_macro_statement(parser);
        case TOK_KEY_FUNC: return parse_function_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_ENUM: return parse_enum_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_MODULE: return parse_module_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_EVENT: return parse_event_declaration(parser, access_specifier, storage_specifier);
        case TOK_KEY_CLASS:
        case TOK_KEY_STRUCT: return parse_class_declaration(parser, access_specifier, storage_specifier);
        case TOK_OP_SEMICOLON: return parse_empty_statement(parser);
        case TOK_KEY_VAR:
        case TOK_KEY_CONST: return parse_variable_declaration(parser, true, access_specifier, storage_specifier);
        default: REPORT_ERROR(gravity_lexer_token(lexer), "Unrecognized token %s.", token_name(peek)); return NULL;
    }

    // should never reach this point
    assert(0);
    return NULL;
}